

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalSubscriptMat4x3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float local_a8 [4];
  float local_98 [4];
  float local_88 [2];
  Vector<float,_3> res_4;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Vector<float,_3> res_3;
  Vector<float,_3> res_5;
  float local_24 [3];
  int local_18 [6];
  
  local_24[1] = (c->coords).m_data[1];
  local_24[2] = (c->coords).m_data[2];
  local_24[0] = (c->coords).m_data[0];
  res_5.m_data[2] = (c->coords).m_data[3];
  res_5.m_data[0] = local_24[1];
  res_5.m_data[1] = local_24[2];
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  res_4.m_data[0] = 0.0;
  lVar1 = 0;
  do {
    res_4.m_data[lVar1 + -2] = res_5.m_data[lVar1] * 0.5;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_2.m_data[0] = 0.0;
  stack0xffffffffffffff88 = 0;
  lVar1 = 0;
  do {
    res_4.m_data[lVar1 + 2] = local_24[lVar1] + res_4.m_data[lVar1 + -2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_3.m_data[1] = local_24[2];
  res_3.m_data[2] = res_5.m_data[2];
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  lVar1 = 0;
  do {
    local_98[lVar1] = res_3.m_data[lVar1 + 1] * 0.25;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res.m_data[0] = 0.0;
  stack0xffffffffffffff98 = 0;
  lVar1 = 0;
  do {
    res_2.m_data[lVar1 + 2] = res_4.m_data[lVar1 + 2] + local_98[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_1.m_data[2] = res_5.m_data[2];
  res_3.m_data[0] = local_24[1];
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  lVar1 = 0;
  do {
    local_a8[lVar1] = res_1.m_data[lVar1 + 2] * 0.125;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_1.m_data[0] = 0.0;
  stack0xffffffffffffffa8 = 0;
  lVar1 = 0;
  do {
    res.m_data[lVar1 + 2] = res_2.m_data[lVar1 + 2] + local_a8[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar1 = 2;
  do {
    (c->color).m_data[local_18[lVar1]] = res.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

void evalSubscriptMat4x3	(ShaderEvalContext& c) { c.color.xyz()	= c.coords.swizzle(0,1,2) + 0.5f*c.coords.swizzle(1,2,3) + 0.25f*c.coords.swizzle(2,3,0) + 0.125f*c.coords.swizzle(3,0,1); }